

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TokenKind kind)

{
  short in_DI;
  bool local_1;
  
  if (((in_DI == 0xf) || (in_DI == 0x18)) || (in_DI == 0x86)) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleExpression(kind);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleValueRangeElement(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenBracket:
        case TokenKind::Comma:
        case TokenKind::DefaultKeyword:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}